

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O1

int __thiscall leveldb::RecoveryTest::NumTables(RecoveryTest *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  
  GetFiles(&local_28,this,kTableFile);
  if (local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return (int)((ulong)((long)local_28.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_28.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int NumTables() { return GetFiles(kTableFile).size(); }